

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSortersTestCase.cpp
# Opt level: O2

void __thiscall FIX::TestgroupOrder::~TestgroupOrder(TestgroupOrder *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(groupOrder)
{
  int order[6] = { 50, 12, 100, 11, 49, 0 };
  message_order sorter( order );

  CHECK( !sorter(50, 50) );
  CHECK( sorter(50, 12) );
  CHECK( sorter(50, 100) );
  CHECK( sorter(50, 11) );
  CHECK( sorter(50, 49) );

  CHECK( !sorter(12, 50) );
  CHECK( !sorter(12, 12) );
  CHECK( sorter(12, 100) );
  CHECK( sorter(12, 11) );
  CHECK( sorter(12, 49) );

  CHECK( !sorter(100, 50) );
  CHECK( !sorter(100, 12) );
  CHECK( !sorter(100, 100) );
  CHECK( sorter(100, 11) );
  CHECK( sorter(100, 49) );

  CHECK( !sorter(11, 50) );
  CHECK( !sorter(11, 12) );
  CHECK( !sorter(11, 100) );
  CHECK( !sorter(11, 11) );
  CHECK( sorter(11, 49) );

  CHECK( !sorter(49, 50) );
  CHECK( !sorter(49, 12) );
  CHECK( !sorter(49, 100) );
  CHECK( !sorter(49, 11) );
  CHECK( !sorter(49, 49) );

  CHECK( sorter(50, 49) );
  CHECK( sorter(50, 51) );

  CHECK( sorter(12, 11) );
  CHECK( sorter(12, 13) );

  CHECK( sorter(100, 99) );
  CHECK( sorter(100, 101) );

  CHECK( sorter(11, 10) );
  CHECK( sorter(11, 13) );

  CHECK( sorter(49, 48) );
  CHECK( sorter(49, 51) );
}